

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::anon_unknown_0::DatarateTestLarge::BasicRateTargetingCBRSpikeTest
          (DatarateTestLarge *this)

{
  bool bVar1;
  __tuple_element_t<4UL,_tuple<const_CodecFactory_*,_TestMode,_int,_unsigned_int,_int>_> *p_Var2;
  char *pcVar3;
  long in_RDI;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  int bitrate_array [2];
  I420VideoSource video;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffe2c;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffe34;
  double *in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  int iVar6;
  Message *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  Type type;
  HasNewFatalFailureHelper *in_stack_fffffffffffffe60;
  uint in_stack_fffffffffffffe70;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffea8;
  AssertHelper *in_stack_fffffffffffffeb0;
  AssertionResult local_138 [2];
  double local_118;
  AssertionResult local_110 [2];
  double local_f0;
  AssertionResult local_e8 [2];
  uint local_c4;
  HasNewFatalFailureHelper local_c0;
  undefined8 local_a8 [3];
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [104];
  
  *(undefined4 *)(in_RDI + 0xd0) = 500;
  *(undefined4 *)(in_RDI + 0xd4) = 500;
  *(undefined4 *)(in_RDI + 0xcc) = 1000;
  *(undefined4 *)(in_RDI + 0x6c) = 0;
  *(undefined4 *)(in_RDI + 0xbc) = 2;
  *(undefined4 *)(in_RDI + 0xc0) = 0x38;
  *(undefined4 *)(in_RDI + 0x90) = 1;
  *(undefined4 *)(in_RDI + 0x68) = 0;
  *(undefined4 *)(in_RDI + 0xf0) = 3000;
  *(undefined4 *)(in_RDI + 0xec) = 3000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"desktopqvga2.320_240.yuv",&local_89);
  uVar5 = 800;
  uVar4 = 0;
  libaom_test::I420VideoSource::I420VideoSource
            ((I420VideoSource *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             (uint)((ulong)in_stack_fffffffffffffe50 >> 0x20),(uint)in_stack_fffffffffffffe50,
             (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),(int)in_stack_fffffffffffffe48,
             in_stack_fffffffffffffe70,(int)in_RDI);
  type = (Type)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  local_a8[0] = 0xc800000064;
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  ::GetParam();
  p_Var2 = std::get<4ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int,unsigned_int,int>
                     ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                       *)0x7831a6);
  *(undefined4 *)(in_RDI + 0xb8) = *(undefined4 *)((long)local_a8 + (long)*p_Var2 * 4);
  (**(code **)(*(long *)(in_RDI + 0x18) + 0x98))(in_RDI + 0x18);
  *(undefined8 *)(in_RDI + 0x468) = 0x4008000000000000;
  *(undefined8 *)(in_RDI + 0x470) = 0x4020000000000000;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(in_stack_fffffffffffffe60)
    ;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (**(code **)(*(long *)(in_RDI + 0x18) + 0x10))(in_RDI + 0x18,local_68);
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(&local_c0);
    if (bVar1) {
      local_c4 = 2;
    }
    else {
      local_c4 = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT44(in_stack_fffffffffffffe34,uVar5));
    if (local_c4 == 0) {
      local_f0 = (double)*(uint *)(in_RDI + 0xb8) * 0.85;
      testing::internal::CmpHelperGE<double,double>
                (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                 (double *)CONCAT44(in_stack_fffffffffffffe34,uVar5));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe60);
        in_stack_fffffffffffffe60 =
             (HasNewFatalFailureHelper *)
             testing::Message::operator<<
                       ((Message *)CONCAT44(in_stack_fffffffffffffe34,uVar5),
                        (char (*) [61])CONCAT44(in_stack_fffffffffffffe2c,uVar4));
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x7834aa);
        type = (Type)((ulong)pcVar3 >> 0x20);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffe60,type,(char *)in_stack_fffffffffffffe50,
                   (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),in_stack_fffffffffffffe40);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffeb0,(Message *)in_stack_fffffffffffffea8._M_head_impl);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe34,uVar5));
        testing::Message::~Message((Message *)0x783504);
      }
      local_c4 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x78358b);
      if (local_c4 == 0) {
        local_118 = (double)*(uint *)(in_RDI + 0xb8) * 1.19;
        testing::internal::CmpHelperLE<double,double>
                  (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                   (double *)CONCAT44(in_stack_fffffffffffffe34,uVar5));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_110);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe60);
          in_stack_fffffffffffffe50 =
               testing::Message::operator<<
                         ((Message *)CONCAT44(in_stack_fffffffffffffe34,uVar5),
                          (char (*) [63])CONCAT44(in_stack_fffffffffffffe2c,uVar4));
          in_stack_fffffffffffffe48 =
               testing::AssertionResult::failure_message((AssertionResult *)0x783651);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffe60,type,
                     (char *)in_stack_fffffffffffffe50,
                     (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),in_stack_fffffffffffffe40);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffeb0,(Message *)in_stack_fffffffffffffea8._M_head_impl);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe34,uVar5));
          testing::Message::~Message((Message *)0x7836ab);
        }
        local_c4 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x78372f);
        if (local_c4 == 0) {
          testing::internal::CmpHelperLE<int,int>
                    (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                     (int *)in_stack_fffffffffffffe38,
                     (int *)CONCAT44(in_stack_fffffffffffffe34,uVar5));
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_138);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffe60);
            in_stack_fffffffffffffe40 =
                 testing::AssertionResult::failure_message((AssertionResult *)0x7837c2);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffe60,type,
                       (char *)in_stack_fffffffffffffe50,
                       (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),in_stack_fffffffffffffe40);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffeb0,(Message *)in_stack_fffffffffffffea8._M_head_impl);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe34,uVar5));
            testing::Message::~Message((Message *)0x78381f);
          }
          local_c4 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x7838a3);
          if (local_c4 == 0) {
            testing::internal::CmpHelperLT<int,int>
                      (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                       (int *)in_stack_fffffffffffffe38,
                       (int *)CONCAT44(in_stack_fffffffffffffe34,uVar5));
            iVar6 = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
            bVar1 = testing::AssertionResult::operator_cast_to_bool
                              ((AssertionResult *)&stack0xfffffffffffffea0);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffffe60);
              testing::AssertionResult::failure_message((AssertionResult *)0x783924);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffffe60,type,
                         (char *)in_stack_fffffffffffffe50,iVar6,in_stack_fffffffffffffe40);
              testing::internal::AssertHelper::operator=
                        (in_stack_fffffffffffffeb0,(Message *)in_stack_fffffffffffffea8._M_head_impl
                        );
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe34,uVar5));
              testing::Message::~Message((Message *)0x783972);
            }
            local_c4 = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x7839ed);
            if (local_c4 == 0) {
              local_c4 = 0;
            }
          }
        }
      }
      goto LAB_00783a05;
    }
    if (local_c4 != 2) goto LAB_00783a05;
  }
  iVar6 = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  testing::Message::Message((Message *)in_stack_fffffffffffffe60);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffe60,type,(char *)in_stack_fffffffffffffe50,iVar6,
             in_stack_fffffffffffffe40);
  testing::internal::AssertHelper::operator=
            (in_stack_fffffffffffffeb0,(Message *)in_stack_fffffffffffffea8._M_head_impl);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe34,uVar5));
  testing::Message::~Message((Message *)0x7833ae);
  local_c4 = 1;
LAB_00783a05:
  libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x783a12);
  return;
}

Assistant:

virtual void BasicRateTargetingCBRSpikeTest() {
    cfg_.rc_buf_initial_sz = 500;
    cfg_.rc_buf_optimal_sz = 500;
    cfg_.rc_buf_sz = 1000;
    cfg_.rc_dropframe_thresh = 0;
    cfg_.rc_min_quantizer = 2;
    cfg_.rc_max_quantizer = 56;
    cfg_.rc_end_usage = AOM_CBR;
    cfg_.g_lag_in_frames = 0;
    cfg_.kf_max_dist = 3000;
    cfg_.kf_min_dist = 3000;

    ::libaom_test::I420VideoSource video("desktopqvga2.320_240.yuv", 320, 240,
                                         30, 1, 0, 800);
    const int bitrate_array[2] = { 100, 200 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    ResetModel();
    max_perc_spike_ = 3.0;
    max_perc_spike_high_ = 8.0;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    ASSERT_GE(effective_datarate_, cfg_.rc_target_bitrate * 0.85)
        << " The datarate for the file is lower than target by too much!";
    ASSERT_LE(effective_datarate_, cfg_.rc_target_bitrate * 1.19)
        << " The datarate for the file is greater than target by too much!";
    ASSERT_LE(num_spikes_, 10);
    ASSERT_LT(num_spikes_high_, 1);
  }